

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanNotBack(UnicodeSetStringSpan *this,UChar *s,int32_t length)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t length_00;
  int32_t iVar3;
  int32_t length_01;
  UnicodeString *this_00;
  char16_t *t;
  int32_t length16;
  UChar *s16;
  UnicodeString *string;
  int32_t cpLength;
  int32_t stringsLength;
  int32_t i;
  int32_t pos;
  int32_t length_local;
  UChar *s_local;
  UnicodeSetStringSpan *this_local;
  
  iVar2 = UVector::size(this->strings);
  stringsLength = length;
  while( true ) {
    length_00 = UnicodeSet::spanBack(this->pSpanNotSet,s,stringsLength,USET_SPAN_NOT_CONTAINED);
    if (length_00 == 0) {
      return 0;
    }
    iVar3 = spanOneBack(&this->spanSet,s,length_00);
    if (0 < iVar3) break;
    for (cpLength = 0; cpLength < iVar2; cpLength = cpLength + 1) {
      if (this->spanLengths[cpLength] != 0xff) {
        this_00 = (UnicodeString *)UVector::elementAt(this->strings,cpLength);
        t = UnicodeString::getBuffer(this_00);
        length_01 = UnicodeString::length(this_00);
        if ((length_01 <= length_00) &&
           (UVar1 = matches16CPB(s,length_00 - length_01,length,t,length_01), UVar1 != '\0')) {
          return length_00;
        }
      }
    }
    stringsLength = iVar3 + length_00;
    if (stringsLength == 0) {
      return 0;
    }
  }
  return length_00;
}

Assistant:

int32_t UnicodeSetStringSpan::spanNotBack(const UChar *s, int32_t length) const {
    int32_t pos=length;
    int32_t i, stringsLength=strings.size();
    do {
        // Span until we find a code point from the set,
        // or a code point that starts or ends some string.
        pos=pSpanNotSet->spanBack(s, pos, USET_SPAN_NOT_CONTAINED);
        if(pos==0) {
            return 0;  // Reached the start of the string.
        }

        // Check whether the current code point is in the original set,
        // without the string starts and ends.
        int32_t cpLength=spanOneBack(spanSet, s, pos);
        if(cpLength>0) {
            return pos;  // There is a set element at pos.
        }

        // Try to match the strings at pos.
        for(i=0; i<stringsLength; ++i) {
            // Use spanLengths rather than a spanBackLengths pointer because
            // it is easier and we only need to know whether the string is irrelevant
            // which is the same in either array.
            if(spanLengths[i]==ALL_CP_CONTAINED) {
                continue;  // Irrelevant string.
            }
            const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
            const UChar *s16=string.getBuffer();
            int32_t length16=string.length();
            if(length16<=pos && matches16CPB(s, pos-length16, length, s16, length16)) {
                return pos;  // There is a set element at pos.
            }
        }

        // The span(while not contained) ended on a string start/end which is
        // not in the original set. Skip this code point and continue.
        // cpLength<0
        pos+=cpLength;
    } while(pos!=0);
    return 0;  // Reached the start of the string.
}